

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<bool_const&,pbrt::RenderingCoordinateSystem_const&,int_const&,pbrt::LogLevel_const&,std::__cxx11::string_const&,bool_const&,bool_const&,bool_const&,bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
               (string *s,char *fmt,bool *v,RenderingCoordinateSystem *args,int *args_1,
               LogLevel *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               bool *args_4,bool *args_5,bool *args_6,bool *args_7,optional<int> *args_8,
               optional<int> *args_9,bool *args_10,bool *args_11,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_12,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_13,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_14,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_15,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_16,
               optional<pbrt::Bounds2<float>_> *args_17,optional<pbrt::Bounds2<int>_> *args_18,
               optional<pbrt::Point2<int>_> *args_19,float *args_20)

{
  long lVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  optional<pbrt::Bounds2<float>_> *in_RDX;
  float *unaff_RBX;
  optional<pbrt::Bounds2<int>_> *in_RSI;
  char *pcVar3;
  optional<pbrt::Point2<int>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  byte bVar4;
  byte bVar5;
  undefined1 uVar6;
  RenderingCoordinateSystem *in_stack_00000008;
  bool *in_stack_00000010;
  string *in_stack_00000018;
  char *in_stack_00000020;
  string *in_stack_00000028;
  LogLevel *in_stack_00000038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000040;
  bool *in_stack_00000048;
  bool *in_stack_00000050;
  bool *in_stack_00000058;
  bool *in_stack_00000060;
  optional<int> *in_stack_00000068;
  optional<int> *in_stack_00000070;
  bool *in_stack_00000078;
  bool *in_stack_00000080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000090;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffc20;
  char **in_stack_fffffffffffffc28;
  char **in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  optional<pbrt::Bounds2<float>_> *in_stack_fffffffffffffca8;
  optional<pbrt::Bounds2<int>_> *in_stack_fffffffffffffcb0;
  optional<pbrt::Point2<int>_> *in_stack_fffffffffffffcb8;
  float *in_stack_fffffffffffffcc0;
  string local_2a8 [32];
  string local_288 [32];
  undefined8 local_268;
  string local_260 [32];
  stringstream local_240 [16];
  undefined1 local_230 [280];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  LogLevel *in_stack_fffffffffffffef0;
  int *in_stack_fffffffffffffef8;
  RenderingCoordinateSystem *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  string local_b8 [8];
  bool *in_stack_ffffffffffffff50;
  bool *in_stack_ffffffffffffff58;
  bool *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  optional<int> *in_stack_ffffffffffffff70;
  undefined5 in_stack_ffffffffffffff78;
  bool *in_stack_ffffffffffffff80;
  bool *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  
  copyToFormatString(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,0x2a);
  bVar4 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,0x73);
  bVar5 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,100);
  uVar6 = lVar1 != -1;
  if ((bVar4 & 1) == 0) {
    if ((bVar5 & 1) == 0) {
      if ((bool)uVar6) {
        uVar2 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,100);
        IntegerFormatTrait<bool>::fmt();
        std::__cxx11::string::replace((ulong)&stack0xffffffffffffff80,uVar2,(char *)0x1);
        std::__cxx11::string::c_str();
        formatOne<bool_const&>(in_stack_fffffffffffffc38,(bool *)in_stack_fffffffffffffc30);
        std::__cxx11::string::operator+=((string *)in_RDI,local_b8);
        std::__cxx11::string::~string(local_b8);
      }
      else if ((bVar5 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          LogFatal((LogLevel)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
                   (char *)in_stack_fffffffffffffcb8,(int)((ulong)in_stack_fffffffffffffcb0 >> 0x20)
                   ,(char *)in_stack_fffffffffffffca8);
        }
        std::__cxx11::string::c_str();
        formatOne<bool_const&>(in_stack_fffffffffffffc38,(bool *)in_stack_fffffffffffffc30);
        std::__cxx11::string::operator+=((string *)in_RDI,local_2a8);
        std::__cxx11::string::~string(local_2a8);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_240);
        std::ostream::operator<<(local_230,(bool)((in_RDX->optionalValue).__data[0] & 1));
        std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        local_268 = std::__cxx11::string::c_str();
        formatOne<char_const*>(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
        std::__cxx11::string::operator+=((string *)in_RDI,local_260);
        std::__cxx11::string::~string(local_260);
        std::__cxx11::string::~string(local_288);
        std::__cxx11::stringstream::~stringstream(local_240);
      }
    }
    else {
      pcVar3 = "false";
      if (((in_RDX->optionalValue).__data[0] & 1) != 0) {
        pcVar3 = "true";
      }
      std::__cxx11::string::operator+=((string *)in_RDI,pcVar3);
    }
    stringPrintfRecursive<pbrt::RenderingCoordinateSystem_const&,int_const&,pbrt::LogLevel_const&,std::__cxx11::string_const&,bool_const&,bool_const&,bool_const&,bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,
               (bool *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff70,
               (optional<int> *)
               CONCAT17(bVar4,CONCAT16(bVar5,CONCAT15(uVar6,in_stack_ffffffffffffff78))),
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff98,in_R9,in_R8,in_RCX,in_RDX,in_RSI,in_RDI,unaff_RBX);
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,pbrt::RenderingCoordinateSystem_const&,int_const&,pbrt::LogLevel_const&,std::__cxx11::string_const&,bool_const&,bool_const&,bool_const&,bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
              (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
               in_stack_00000008,(int *)in_R9,in_stack_00000038,in_stack_00000040,in_stack_00000048,
               in_stack_00000050,in_stack_00000058,in_stack_00000060,in_stack_00000068,
               in_stack_00000070,in_stack_00000078,in_stack_00000080,in_stack_00000088,
               in_stack_00000090,in_stack_fffffffffffffc90,in_stack_fffffffffffffc98,
               in_stack_fffffffffffffca0,in_stack_fffffffffffffca8,in_stack_fffffffffffffcb0,
               in_stack_fffffffffffffcb8,in_stack_fffffffffffffcc0);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}